

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::WildcardPattern::WildcardPattern
          (WildcardPattern *this,string *pattern,Choice caseSensitivity)

{
  string *__return_storage_ptr__;
  bool bVar1;
  allocator local_41;
  string local_40;
  
  this->_vptr_WildcardPattern = (_func_int **)&PTR__WildcardPattern_00142068;
  this->m_caseSensitivity = caseSensitivity;
  this->m_wildcard = NoWildcard;
  __return_storage_ptr__ = &this->m_pattern;
  adjustCase(__return_storage_ptr__,this,pattern);
  std::__cxx11::string::string((string *)&local_40,"*",&local_41);
  bVar1 = startsWith(__return_storage_ptr__,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    this->m_wildcard = WildcardAtStart;
  }
  std::__cxx11::string::string((string *)&local_40,"*",&local_41);
  bVar1 = endsWith(__return_storage_ptr__,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    *(undefined1 *)&this->m_wildcard = (char)this->m_wildcard | WildcardAtEnd;
  }
  return;
}

Assistant:

WildcardPattern( std::string const& pattern, CaseSensitive::Choice caseSensitivity )
        :   m_caseSensitivity( caseSensitivity ),
            m_wildcard( NoWildcard ),
            m_pattern( adjustCase( pattern ) )
        {
            if( startsWith( m_pattern, "*" ) ) {
                m_pattern = m_pattern.substr( 1 );
                m_wildcard = WildcardAtStart;
            }
            if( endsWith( m_pattern, "*" ) ) {
                m_pattern = m_pattern.substr( 0, m_pattern.size()-1 );
                m_wildcard = static_cast<WildcardPosition>( m_wildcard | WildcardAtEnd );
            }
        }